

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void gl4cts::EnhancedLayouts::Utils::VertexArray::Disable
               (Functions *gl,GLuint index,Type *type,GLuint n_array_elements)

{
  GLenum err;
  int iVar1;
  GLuint column;
  uint uVar2;
  
  for (iVar1 = 0; iVar1 != n_array_elements + (n_array_elements == 0); iVar1 = iVar1 + 1) {
    for (uVar2 = 1; uVar2 <= type->m_n_columns; uVar2 = uVar2 + 1) {
      (*gl->disableVertexAttribArray)(index);
      err = (*gl->getError)();
      glu::checkError(err,"DisableVertexAttribArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0xe51);
      index = index + 1;
    }
  }
  return;
}

Assistant:

void VertexArray::Disable(const Functions& gl, GLuint index, const Type& type, GLuint n_array_elements)
{
	/* If attribute is not an array */
	if (0 == n_array_elements)
	{
		n_array_elements = 1;
	}

	/* For each element in array */
	for (GLuint element = 0; element < n_array_elements; ++element)
	{
		/* For each column in matrix */
		for (GLuint column = 1; column <= type.m_n_columns; ++column)
		{
			/* Enable attribute array */
			gl.disableVertexAttribArray(index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");

			/* Next location */
			index += 1;
		}
	}
}